

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O2

void __thiscall
soul::SourceCodeOperations::replaceText
          (SourceCodeOperations *this,CodeLocation *start,CodeLocation *end,string *newText)

{
  size_t sVar1;
  size_t sVar2;
  undefined1 local_50 [48];
  
  sVar1 = CodeLocation::getByteOffsetInFile(start);
  sVar2 = CodeLocation::getByteOffsetInFile(end);
  local_50._8_8_ = sVar2 - sVar1;
  if (sVar2 < sVar1) {
    throwInternalCompilerError("e >= s","replaceText",0x8f);
  }
  if ((this->applyModification).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_50._0_8_ = sVar1;
    std::__cxx11::string::string((string *)(local_50 + 0x10),(string *)newText);
    std::function<void_(const_soul::SourceCodeOperations::TextModificationOp_&)>::operator()
              (&this->applyModification,(TextModificationOp *)local_50);
    std::__cxx11::string::~string((string *)(local_50 + 0x10));
    return;
  }
  throwInternalCompilerError("applyModification != nullptr","replaceText",0x90);
}

Assistant:

void SourceCodeOperations::replaceText (CodeLocation start, CodeLocation end, std::string newText)
{
    auto s = start.getByteOffsetInFile();
    auto e = end.getByteOffsetInFile();
    SOUL_ASSERT (e >= s);
    SOUL_ASSERT (applyModification != nullptr);
    applyModification ({ s, e - s, std::move (newText) });
}